

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O3

void __thiscall Projector::Projector(Projector *this,ofstream *myFile)

{
  ostream *poVar1;
  long *plVar2;
  
  this->LED = false;
  (this->CurrentImageLoc)._M_dataplus._M_p = (pointer)&(this->CurrentImageLoc).field_2;
  (this->CurrentImageLoc)._M_string_length = 0;
  (this->CurrentImageLoc).field_2._M_local_buf[0] = '\0';
  cv::Mat::Mat(&this->CurrentImage);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"PROJECTOR INITIALIZED!",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)myFile + -0x18) + (char)myFile);
  std::ostream::put((char)myFile);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"PROJECTOR INITIALIZED!",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

Projector::Projector(ofstream &myFile)
{
	//Initializez Projector

	cout << endl << "PROJECTOR INITIALIZED!" << endl << endl;
	myFile << endl << "PROJECTOR INITIALIZED!" << endl << endl;
}